

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O1

pair<unsigned_long,_bool> __thiscall
google::protobuf::io::CodedInputStream::ReadVarint64Fallback(CodedInputStream *this)

{
  byte *pbVar1;
  bool bVar2;
  undefined7 extraout_var;
  Nonnull<const_char_*> pcVar3;
  size_t offset;
  long lVar4;
  undefined8 in_RDX;
  undefined7 uVar8;
  byte *pbVar5;
  long lVar6;
  undefined8 extraout_RDX;
  ulong uVar7;
  long lVar9;
  pair<unsigned_long,_bool> pVar10;
  uint64_t temp;
  unsigned_long local_20 [2];
  
  pbVar1 = this->buffer_;
  pbVar5 = this->buffer_end_;
  if (((int)pbVar5 - (int)pbVar1 < 10) && ((pbVar5 <= pbVar1 || ((char)pbVar5[-1] < '\0')))) {
    bVar2 = ReadVarint64Slow(this,local_20);
    uVar7 = CONCAT71(extraout_var,bVar2) & 0xffffffff;
  }
  else {
    if ((char)*pbVar1 < '\0') {
      pcVar3 = (Nonnull<const_char_*>)0x0;
    }
    else {
      pcVar3 = absl::lts_20250127::log_internal::MakeCheckOpString<unsigned_char,long>
                         (*pbVar1,0x80,"buffer[0] >= 128");
      in_RDX = extraout_RDX;
    }
    if (pcVar3 != (Nonnull<const_char_*>)0x0) {
      ReadVarint64Fallback();
    }
    if ((long)(char)pbVar1[1] < 0) {
      if ((long)(char)pbVar1[2] < 0) {
        if ((long)(char)pbVar1[3] < 0) {
          if ((long)(char)pbVar1[4] < 0) {
            if ((long)(char)pbVar1[5] < 0) {
              if ((long)(char)pbVar1[6] < 0) {
                if ((long)(char)pbVar1[7] < 0) {
                  if ((long)(char)pbVar1[8] < 0) {
                    local_20[0] = (unsigned_long)(char)pbVar1[9];
                    if ((long)local_20[0] < 0) {
                      bVar2 = false;
                      uVar8 = 0;
                      lVar9 = 0xb;
                    }
                    else {
                      local_20[0] = local_20[0] << 0x3f;
                      lVar4 = 0;
                      lVar9 = 10;
                      pbVar5 = pbVar1;
                      do {
                        lVar6 = (ulong)*pbVar5 - 0x80 << ((byte)lVar4 & 0x3f);
                        local_20[0] = local_20[0] + lVar6;
                        lVar4 = lVar4 + 7;
                        pbVar5 = pbVar5 + 1;
                        uVar8 = (undefined7)((ulong)lVar6 >> 8);
                        bVar2 = true;
                      } while (lVar4 != 0x3f);
                    }
                  }
                  else {
                    local_20[0] = (long)(char)pbVar1[8] << 0x38;
                    lVar4 = 0;
                    lVar9 = 9;
                    pbVar5 = pbVar1;
                    do {
                      lVar6 = (ulong)*pbVar5 - 0x80 << ((byte)lVar4 & 0x3f);
                      local_20[0] = local_20[0] + lVar6;
                      lVar4 = lVar4 + 7;
                      pbVar5 = pbVar5 + 1;
                      uVar8 = (undefined7)((ulong)lVar6 >> 8);
                      bVar2 = true;
                    } while (lVar4 != 0x38);
                  }
                }
                else {
                  local_20[0] = (long)(char)pbVar1[7] << 0x31;
                  lVar4 = 0;
                  lVar9 = 8;
                  pbVar5 = pbVar1;
                  do {
                    lVar6 = (ulong)*pbVar5 - 0x80 << ((byte)lVar4 & 0x3f);
                    local_20[0] = local_20[0] + lVar6;
                    lVar4 = lVar4 + 7;
                    pbVar5 = pbVar5 + 1;
                    uVar8 = (undefined7)((ulong)lVar6 >> 8);
                    bVar2 = true;
                  } while (lVar4 != 0x31);
                }
              }
              else {
                local_20[0] = (long)(char)pbVar1[6] << 0x2a;
                lVar4 = 0;
                lVar9 = 7;
                pbVar5 = pbVar1;
                do {
                  lVar6 = (ulong)*pbVar5 - 0x80 << ((byte)lVar4 & 0x3f);
                  local_20[0] = local_20[0] + lVar6;
                  lVar4 = lVar4 + 7;
                  pbVar5 = pbVar5 + 1;
                  uVar8 = (undefined7)((ulong)lVar6 >> 8);
                  bVar2 = true;
                } while (lVar4 != 0x2a);
              }
            }
            else {
              local_20[0] = (long)(char)pbVar1[5] << 0x23;
              lVar4 = 0;
              lVar9 = 6;
              pbVar5 = pbVar1;
              do {
                lVar6 = (ulong)*pbVar5 - 0x80 << ((byte)lVar4 & 0x3f);
                local_20[0] = local_20[0] + lVar6;
                lVar4 = lVar4 + 7;
                pbVar5 = pbVar5 + 1;
                uVar8 = (undefined7)((ulong)lVar6 >> 8);
                bVar2 = true;
              } while (lVar4 != 0x23);
            }
          }
          else {
            local_20[0] = (long)(char)pbVar1[4] << 0x1c;
            lVar9 = 0;
            pbVar5 = pbVar1;
            do {
              local_20[0] = local_20[0] + ((ulong)*pbVar5 - 0x80 << ((byte)lVar9 & 0x3f));
              lVar9 = lVar9 + 7;
              pbVar5 = pbVar5 + 1;
            } while (lVar9 != 0x1c);
            uVar8 = (undefined7)((ulong)pbVar5 >> 8);
            bVar2 = true;
            lVar9 = 5;
          }
        }
        else {
          local_20[0] = (long)(char)pbVar1[3] << 0x15;
          lVar9 = 0;
          pbVar5 = pbVar1;
          do {
            local_20[0] = local_20[0] + ((ulong)*pbVar5 - 0x80 << ((byte)lVar9 & 0x3f));
            lVar9 = lVar9 + 7;
            pbVar5 = pbVar5 + 1;
          } while (lVar9 != 0x15);
          uVar8 = (undefined7)((ulong)pbVar5 >> 8);
          bVar2 = true;
          lVar9 = 4;
        }
      }
      else {
        local_20[0] = (long)(char)pbVar1[2] << 0xe;
        lVar9 = 0;
        pbVar5 = pbVar1;
        do {
          local_20[0] = local_20[0] + ((ulong)*pbVar5 - 0x80 << ((byte)lVar9 & 0x3f));
          lVar9 = lVar9 + 7;
          pbVar5 = pbVar5 + 1;
        } while (lVar9 == 7);
        uVar8 = (undefined7)((ulong)pbVar5 >> 8);
        bVar2 = true;
        lVar9 = 3;
      }
    }
    else {
      local_20[0] = ((long)(char)pbVar1[1] * 0x80 + (ulong)*pbVar1) - 0x80;
      uVar8 = (undefined7)((ulong)in_RDX >> 8);
      bVar2 = true;
      lVar9 = 2;
    }
    if (bVar2) {
      this->buffer_ = pbVar1 + lVar9;
      uVar7 = CONCAT71(uVar8,1);
    }
    else {
      local_20[0] = 0;
      uVar7 = 0;
    }
  }
  pVar10._8_8_ = uVar7;
  pVar10.first = local_20[0];
  return pVar10;
}

Assistant:

std::pair<uint64_t, bool> CodedInputStream::ReadVarint64Fallback() {
  if (BufferSize() >= kMaxVarintBytes ||
      // Optimization:  We're also safe if the buffer is non-empty and it ends
      // with a byte that would terminate a varint.
      (buffer_end_ > buffer_ && !(buffer_end_[-1] & 0x80))) {
    uint64_t temp;
    ::std::pair<bool, const uint8_t*> p = ReadVarint64FromArray(buffer_, &temp);
    if (!p.first) {
      return std::make_pair(0, false);
    }
    buffer_ = p.second;
    return std::make_pair(temp, true);
  } else {
    uint64_t temp;
    bool success = ReadVarint64Slow(&temp);
    return std::make_pair(temp, success);
  }
}